

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::characteristic_function_of_diagram
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          Persistence_intervals *this,double x_min,double x_max,size_t number_of_bins)

{
  double dVar1;
  pointer __s;
  pointer pdVar2;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  allocator_type local_39;
  double local_38;
  double local_30;
  
  local_38 = x_min;
  local_30 = x_max;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,number_of_bins,&local_39);
  __s = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar2) {
    memset(__s,0,((long)pdVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  ppVar3 = (this->intervals).
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->intervals).
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3;
  if (lVar4 != 0) {
    uVar9 = (long)pdVar2 - (long)__s >> 3;
    auVar12._8_4_ = (int)(number_of_bins >> 0x20);
    auVar12._0_8_ = number_of_bins;
    auVar12._12_4_ = 0x45300000;
    dVar10 = (auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)number_of_bins) - 4503599627370496.0);
    dVar11 = local_30 - local_38;
    lVar5 = 0;
    do {
      dVar1 = ppVar3[lVar5].first;
      uVar6 = uVar9;
      if (dVar1 < local_30) {
        uVar6 = 0;
      }
      dVar13 = ((dVar1 - local_38) * dVar10) / dVar11;
      uVar7 = (ulong)dVar13;
      uVar7 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
      if (local_30 <= dVar1) {
        uVar7 = uVar6;
      }
      if (dVar1 <= local_38) {
        uVar7 = uVar6;
      }
      dVar1 = ppVar3[lVar5].second;
      uVar6 = uVar9;
      if (dVar1 < local_30) {
        uVar6 = 0;
      }
      dVar13 = ((dVar1 - local_38) * dVar10) / dVar11;
      uVar8 = (ulong)dVar13;
      uVar8 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
      if (local_30 <= dVar1) {
        uVar8 = uVar6;
      }
      if (dVar1 <= local_38) {
        uVar8 = uVar6;
      }
      if (uVar7 < uVar8) {
        do {
          __s[uVar7] = (ppVar3[lVar5].second - ppVar3[lVar5].first) * (dVar11 / dVar10) + __s[uVar7]
          ;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4 >> 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Persistence_intervals::characteristic_function_of_diagram(double x_min, double x_max,
                                                                              size_t number_of_bins) const {
  bool dbg = false;

  std::vector<double> result(number_of_bins);
  std::fill(result.begin(), result.end(), 0);

  for (size_t i = 0; i != this->intervals.size(); ++i) {
    if (dbg) {
      std::clog << "Interval : " << this->intervals[i].first << " , " << this->intervals[i].second << std::endl;
    }

    size_t beginIt = 0;
    if (this->intervals[i].first < x_min) beginIt = 0;
    if (this->intervals[i].first >= x_max) beginIt = result.size();
    if ((this->intervals[i].first > x_min) && (this->intervals[i].first < x_max)) {
      beginIt = number_of_bins * (this->intervals[i].first - x_min) / (x_max - x_min);
    }

    size_t endIt = 0;
    if (this->intervals[i].second < x_min) endIt = 0;
    if (this->intervals[i].second >= x_max) endIt = result.size();
    if ((this->intervals[i].second > x_min) && (this->intervals[i].second < x_max)) {
      endIt = number_of_bins * (this->intervals[i].second - x_min) / (x_max - x_min);
    }

    if (beginIt > endIt) {
      beginIt = endIt;
    }

    if (dbg) {
      std::clog << "beginIt : " << beginIt << std::endl;
      std::clog << "endIt : " << endIt << std::endl;
    }

    for (size_t pos = beginIt; pos != endIt; ++pos) {
      result[pos] += ((x_max - x_min) / static_cast<double>(number_of_bins)) *
                     (this->intervals[i].second - this->intervals[i].first);
    }
    if (dbg) {
      std::clog << "Result at this stage \n";
      for (size_t aa = 0; aa != result.size(); ++aa) {
        std::clog << result[aa] << " ";
      }
      std::clog << std::endl;
    }
  }
  return result;
}